

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

bool __thiscall
cs::domain_type::add_var_optimal(domain_type *this,string *name,var *val,bool override)

{
  byte bVar1;
  size_t sVar2;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar3;
  byte in_CL;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDX;
  var *in_RDI;
  domain_type *unaff_retaddr;
  any *in_stack_ffffffffffffffb8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  undefined7 in_stack_ffffffffffffffd8;
  var *val_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  bVar1 = in_CL & 1;
  val_00 = in_RDI;
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    (in_RDX,(key_arg<std::__cxx11::basic_string<char>_> *)
                            (CONCAT17(in_CL,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff));
  if (sVar2 == 0) {
    add_var(unaff_retaddr,(string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            val_00);
    bVar4 = true;
  }
  else if (((ulong)in_RDI[0xb].mDat & 1) == 0) {
    if ((bVar1 & 1) == 0) {
      bVar4 = false;
    }
    else {
      add_var(unaff_retaddr,(string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
              val_00);
      bVar4 = true;
    }
  }
  else {
    this_00 = (vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(in_RDI + 8);
    puVar3 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_RDX,
                        (key_arg<std::__cxx11::basic_string<char>_> *)
                        CONCAT17(bVar1,in_stack_ffffffffffffffd8));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](this_00,*puVar3);
    cs_impl::any::operator=((any *)this_00,in_stack_ffffffffffffffb8);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool add_var_optimal(const std::string &name, const var &val, bool override = false)
		{
			if (m_reflect.count(name) > 0) {
				if (optimize) {
					m_slot[m_reflect.at(name)] = val;
					return true;
				}
				else if (override) {
					add_var(name, val);
					return true;
				}
				else
					return false;
			}
			else {
				add_var(name, val);
				return true;
			}
		}